

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O2

RegexPattern *
icu_63::RegexPattern::compile(UText *regex,uint32_t flags,UParseError *pe,UErrorCode *status)

{
  RegexPattern *this;
  undefined4 in_register_00000034;
  void *p;
  RegexCompile compiler;
  RegexCompile local_240;
  
  p = (void *)CONCAT44(in_register_00000034,flags);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((flags & 0xfffffc40) == 0) {
      if ((char)flags < '\0') {
        *status = U_REGEX_UNIMPLEMENTED;
      }
      else {
        this = (RegexPattern *)UMemory::operator_new((UMemory *)0xd8,(size_t)p);
        if (this == (RegexPattern *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          RegexPattern(this);
          if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            this->fFlags = flags;
            RegexCompile::RegexCompile(&local_240,this,status);
            RegexCompile::compile(&local_240,regex,pe,status);
            if (U_ZERO_ERROR < *status) {
              ~RegexPattern(this);
              UMemory::operator_delete((UMemory *)this,regex);
              this = (RegexPattern *)0x0;
            }
            RegexCompile::~RegexCompile(&local_240);
            return this;
          }
          *status = this->fDeferredStatus;
          ~RegexPattern(this);
          UMemory::operator_delete((UMemory *)this,p);
        }
      }
    }
    else {
      *status = U_REGEX_INVALID_FLAG;
    }
  }
  return (RegexPattern *)0x0;
}

Assistant:

void   RegexPattern::dumpOp(int32_t index) const {
    (void)index;  // Suppress warnings in non-debug build.
#if defined(REGEX_DEBUG)
    static const char * const opNames[] = {URX_OPCODE_NAMES};
    int32_t op          = fCompiledPat->elementAti(index);
    int32_t val         = URX_VAL(op);
    int32_t type        = URX_TYPE(op);
    int32_t pinnedType  = type;
    if ((uint32_t)pinnedType >= UPRV_LENGTHOF(opNames)) {
        pinnedType = 0;
    }

    printf("%4d   %08x    %-15s  ", index, op, opNames[pinnedType]);
    switch (type) {
    case URX_NOP:
    case URX_DOTANY:
    case URX_DOTANY_ALL:
    case URX_FAIL:
    case URX_CARET:
    case URX_DOLLAR:
    case URX_BACKSLASH_G:
    case URX_BACKSLASH_X:
    case URX_END:
    case URX_DOLLAR_M:
    case URX_CARET_M:
        // Types with no operand field of interest.
        break;

    case URX_RESERVED_OP:
    case URX_START_CAPTURE:
    case URX_END_CAPTURE:
    case URX_STATE_SAVE:
    case URX_JMP:
    case URX_JMP_SAV:
    case URX_JMP_SAV_X:
    case URX_BACKSLASH_B:
    case URX_BACKSLASH_BU:
    case URX_BACKSLASH_D:
    case URX_BACKSLASH_Z:
    case URX_STRING_LEN:
    case URX_CTR_INIT:
    case URX_CTR_INIT_NG:
    case URX_CTR_LOOP:
    case URX_CTR_LOOP_NG:
    case URX_RELOC_OPRND:
    case URX_STO_SP:
    case URX_LD_SP:
    case URX_BACKREF:
    case URX_STO_INP_LOC:
    case URX_JMPX:
    case URX_LA_START:
    case URX_LA_END:
    case URX_BACKREF_I:
    case URX_LB_START:
    case URX_LB_CONT:
    case URX_LB_END:
    case URX_LBN_CONT:
    case URX_LBN_END:
    case URX_LOOP_C:
    case URX_LOOP_DOT_I:
    case URX_BACKSLASH_H:
    case URX_BACKSLASH_R:
    case URX_BACKSLASH_V:
        // types with an integer operand field.
        printf("%d", val);
        break;

    case URX_ONECHAR:
    case URX_ONECHAR_I:
        if (val < 0x20) {
            printf("%#x", val);
        } else {
            printf("'%s'", CStr(UnicodeString(val))());
        }
        break;

    case URX_STRING:
    case URX_STRING_I:
        {
            int32_t lengthOp       = fCompiledPat->elementAti(index+1);
            U_ASSERT(URX_TYPE(lengthOp) == URX_STRING_LEN);
            int32_t length = URX_VAL(lengthOp);
            UnicodeString str(fLiteralText, val, length);
            printf("%s", CStr(str)());
        }
        break;

    case URX_SETREF:
    case URX_LOOP_SR_I:
        {
            UnicodeString s;
            UnicodeSet *set = (UnicodeSet *)fSets->elementAt(val);
            set->toPattern(s, TRUE);
            printf("%s", CStr(s)());
        }
        break;

    case URX_STATIC_SETREF:
    case URX_STAT_SETREF_N:
        {
            UnicodeString s;
            if (val & URX_NEG_SET) {
                printf("NOT ");
                val &= ~URX_NEG_SET;
            }
            UnicodeSet *set = fStaticSets[val];
            set->toPattern(s, TRUE);
            printf("%s", CStr(s)());
        }
        break;


    default:
        printf("??????");
        break;
    }
    printf("\n");
#endif
}